

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QWidget_*>::appendInitialize(QArrayDataPointer<QWidget_*> *this,qsizetype newSize)

{
  QWidget **ppQVar1;
  QWidget *in_RSI;
  QWidget **in_RDI;
  QWidget **e;
  QWidget **b;
  
  begin((QArrayDataPointer<QWidget_*> *)0x5851d0);
  ppQVar1 = begin((QArrayDataPointer<QWidget_*> *)0x5851e9);
  std::uninitialized_value_construct<QWidget**>(ppQVar1 + (long)in_RSI,in_RDI);
  in_RDI[2] = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }